

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O2

gdImagePtr gdImageCreateFromBmpCtx(gdIOCtxPtr infile)

{
  int *piVar1;
  short sVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bmp_info_t *result;
  bmp_info_t *info;
  gdImagePtr im;
  long lVar8;
  ushort uVar9;
  uint uVar10;
  int *piVar11;
  double dVar12;
  int red;
  short *local_80;
  int *local_78;
  int *local_70;
  ushort local_66;
  int blue;
  int green;
  uint local_5c;
  int index;
  int local_34;
  
  result = (bmp_info_t *)gdCalloc(1,0x10);
  if (result == (bmp_info_t *)0x0) {
    return (gdImagePtr)0x0;
  }
  iVar5 = gdGetWordLSB((short *)result,infile);
  if ((((iVar5 == 0) || (iVar5 = gdGetIntLSB(&result->len,infile), iVar5 == 0)) ||
      (iVar5 = gdGetWordLSB((short *)&result->width,infile), iVar5 == 0)) ||
     (iVar5 = gdGetWordLSB((short *)((long)&result->width + 2),infile), iVar5 == 0))
  goto LAB_00111483;
  piVar11 = &result->height;
  iVar5 = gdGetIntLSB(piVar11,infile);
  if (((iVar5 == 0) || (result->type != 0x4d42)) ||
     (info = (bmp_info_t *)gdCalloc(1,0x30), info == (bmp_info_t *)0x0)) goto LAB_00111483;
  iVar5 = gdGetIntLSB(&info->len,infile);
  if (iVar5 != 0) {
    iVar5 = info->len;
    if (iVar5 == 0xc) {
      iVar5 = gdGetWordLSB((short *)&info->width,infile);
      if (iVar5 != 0) {
        iVar5 = gdGetWordLSB((short *)&info->height,infile);
        if (iVar5 != 0) {
          iVar5 = gdGetWordLSB(&info->numplanes,infile);
          if ((iVar5 != 0) && (iVar5 = gdGetWordLSB(&info->depth,infile), iVar5 != 0)) {
            info->topdown = '\0';
            uVar9 = info->depth;
            if ((uVar9 < 0x19) && ((0x1010112U >> (uVar9 & 0x1f) & 1) != 0)) {
              info->numcolors = 1 << ((byte)uVar9 & 0x1f);
              info->type = 1;
              if (((0 < info->width) && (0 < info->height)) && (0 < info->numplanes)) {
LAB_0011165d:
                if ((short)uVar9 < 0x10) {
                  im = gdImageCreate(info->width,info->height);
                }
                else {
                  im = gdImageCreateTrueColor(info->width,info->height);
                }
                if (im != (gdImagePtr)0x0) {
                  sVar2 = info->depth;
                  if (sVar2 == 0x20) {
LAB_001116e9:
                    index = 0;
                    red = 0;
                    green = 0;
                    blue = 0;
                    local_66 = 0;
                    local_70 = (int *)CONCAT44(local_70._4_4_,1);
                    if (info->enctype != 0) goto LAB_00111dda;
                    lVar8 = gdTell(infile);
                    if ((lVar8 != *piVar11) && (iVar5 = gdSeek(infile,*piVar11), iVar5 == 0))
                    goto LAB_00111dda;
                    iVar6 = ((int)(info->depth / 8) * info->width) % 4;
                    iVar5 = 4 - iVar6;
                    if (iVar6 == 0) {
                      iVar5 = 0;
                    }
                    local_78 = (int *)CONCAT44(local_78._4_4_,iVar5 + 1);
                    local_80 = (short *)((ulong)local_80 & 0xffffffff00000000);
                    while( true ) {
                      if (info->height <= (int)(uint)local_80) break;
                      uVar10 = info->height + ~(uint)local_80;
                      if (info->topdown != '\0') {
                        uVar10 = (uint)local_80;
                      }
                      for (iVar5 = 0; iVar5 < info->width; iVar5 = iVar5 + 1) {
                        if (info->depth == 0x18) {
                          iVar6 = gdGetByte(&blue,infile);
                          if ((iVar6 == 0) || (iVar6 = gdGetByte(&green,infile), iVar6 == 0))
                          goto LAB_00111dda;
                          piVar11 = &red;
LAB_0011185d:
                          iVar6 = gdGetByte(piVar11,infile);
                          if (iVar6 == 0) goto LAB_00111dda;
                        }
                        else {
                          if (info->depth != 0x10) {
                            iVar6 = gdGetByte(&blue,infile);
                            if (((iVar6 != 0) && (iVar6 = gdGetByte(&green,infile), iVar6 != 0)) &&
                               (iVar6 = gdGetByte(&red,infile), iVar6 != 0)) {
                              piVar11 = &index;
                              goto LAB_0011185d;
                            }
                            goto LAB_00111dda;
                          }
                          iVar6 = gdGetWordLSB((short *)&local_66,infile);
                          if (iVar6 == 0) goto LAB_00111dda;
                          red = local_66 >> 7 & 0xf8;
                          green = local_66 >> 2 & 0xf8;
                          blue = (local_66 & 0x1f) << 3;
                        }
                        gdImageSetPixel(im,iVar5,uVar10,green * 0x100 + red * 0x10000 + blue);
                      }
                      iVar5 = (uint)local_78;
                      while (iVar5 + -1 != 0 && 0 < iVar5) {
                        iVar6 = gdGetByte(&red,infile);
                        iVar5 = iVar5 + -1;
                        if (iVar6 == 0) goto LAB_00111dda;
                      }
                      local_80 = (short *)CONCAT44(local_80._4_4_,(uint)local_80 + 1);
                    }
                  }
                  else if (sVar2 == 4) {
                    index = 0;
                    red = 0;
                    local_70 = (int *)CONCAT44(local_70._4_4_,1);
                    if ((info->enctype & 0xfffffffdU) != 0) goto LAB_00111dda;
                    uVar10 = info->numcolors;
                    if (uVar10 == 0) {
                      info->numcolors = 0x10;
                      uVar10 = 0x10;
                    }
                    else if (0x10 < uVar10) goto LAB_00111dda;
                    iVar5 = bmp_read_palette(im,infile,uVar10,(uint)(info->type == 2));
                    if (iVar5 != 0) goto LAB_00111dda;
                    im->colorsTotal = info->numcolors;
                    lVar8 = gdTell(infile);
                    if ((lVar8 != *piVar11) && (iVar5 = gdSeek(infile,*piVar11), iVar5 == 0))
                    goto LAB_00111dda;
                    dVar12 = ceil((double)info->width * 0.5);
                    iVar5 = 4 - (int)dVar12 % 4;
                    if ((int)dVar12 % 4 == 0) {
                      iVar5 = 0;
                    }
                    local_80 = (short *)CONCAT44(local_80._4_4_,iVar5);
                    if (info->enctype == 2) {
LAB_00111dc0:
                      iVar5 = bmp_read_rle(im,infile,info);
                      if (iVar5 != 0) goto LAB_00111dda;
                    }
                    else {
                      if (info->enctype != 0) goto LAB_00111dda;
                      local_80 = (short *)CONCAT44(local_80._4_4_,iVar5 + 1);
                      local_78 = (int *)((ulong)local_78 & 0xffffffff00000000);
                      while( true ) {
                        if (info->height <= (int)(uint)local_78) break;
                        uVar10 = info->height + ~(uint)local_78;
                        if (info->topdown != '\0') {
                          uVar10 = (uint)local_78;
                        }
                        for (iVar5 = 0; iVar5 < info->width; iVar5 = iVar5 + 2) {
                          iVar6 = gdGetByte(&red,infile);
                          if (iVar6 == 0) goto LAB_00111dda;
                          index = (uint)red >> 4 & 0xf;
                          if (im->open[(uint)index] != 0) {
                            im->open[(uint)index] = 0;
                          }
                          gdImageSetPixel(im,iVar5,uVar10,index);
                          if (info->width <= iVar5) break;
                          index = red & 0xf;
                          if (im->open[(uint)index] != 0) {
                            im->open[(uint)index] = 0;
                          }
                          gdImageSetPixel(im,iVar5 + 1,uVar10,index);
                        }
                        iVar5 = (uint)local_80;
                        while (iVar5 + -1 != 0 && 0 < iVar5) {
                          iVar6 = gdGetByte(&index,infile);
                          iVar5 = iVar5 + -1;
                          if (iVar6 == 0) goto LAB_00111dda;
                        }
                        local_78 = (int *)CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                      }
                    }
                  }
                  else if (sVar2 == 8) {
                    index = 0;
                    local_70 = (int *)CONCAT44(local_70._4_4_,1);
                    if (1 < (uint)info->enctype) goto LAB_00111dda;
                    uVar10 = info->numcolors;
                    if (uVar10 == 0) {
                      info->numcolors = 0x100;
                      uVar10 = 0x100;
                    }
                    else if (0x100 < uVar10) goto LAB_00111dda;
                    iVar5 = bmp_read_palette(im,infile,uVar10,(uint)(info->type == 2));
                    if (iVar5 != 0) goto LAB_00111dda;
                    im->colorsTotal = info->numcolors;
                    lVar8 = gdTell(infile);
                    if ((lVar8 != *piVar11) && (iVar5 = gdSeek(infile,*piVar11), iVar5 == 0))
                    goto LAB_00111dda;
                    iVar6 = info->width % 4;
                    iVar5 = 4 - iVar6;
                    if (iVar6 == 0) {
                      iVar5 = 0;
                    }
                    local_80 = (short *)CONCAT44(local_80._4_4_,iVar5);
                    if (info->enctype == 1) goto LAB_00111dc0;
                    if (info->enctype != 0) goto LAB_00111dda;
                    local_80 = (short *)CONCAT44(local_80._4_4_,iVar5 + 1);
                    local_78 = (int *)((ulong)local_78 & 0xffffffff00000000);
                    while( true ) {
                      if (info->height <= (int)(uint)local_78) break;
                      uVar10 = info->height + ~(uint)local_78;
                      if (info->topdown != '\0') {
                        uVar10 = (uint)local_78;
                      }
                      for (iVar5 = 0; iVar5 < info->width; iVar5 = iVar5 + 1) {
                        iVar6 = gdGetByte(&index,infile);
                        if (iVar6 == 0) goto LAB_00111dda;
                        if (im->open[index] != 0) {
                          im->open[index] = 0;
                        }
                        gdImageSetPixel(im,iVar5,uVar10,index);
                      }
                      iVar5 = (uint)local_80;
                      while (iVar5 + -1 != 0 && 0 < iVar5) {
                        iVar6 = gdGetByte(&index,infile);
                        iVar5 = iVar5 + -1;
                        if (iVar6 == 0) goto LAB_00111dda;
                      }
                      local_78 = (int *)CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                    }
                  }
                  else {
                    if ((sVar2 == 0x10) || (sVar2 == 0x18)) goto LAB_001116e9;
                    if (sVar2 != 1) {
                      local_70 = (int *)CONCAT44(local_70._4_4_,1);
                      goto LAB_00111dda;
                    }
                    index = 0;
                    red = 0;
                    local_70 = (int *)CONCAT44(local_70._4_4_,1);
                    if (info->enctype != 0) goto LAB_00111dda;
                    uVar10 = info->numcolors;
                    if (uVar10 == 0) {
                      info->numcolors = 2;
                      uVar10 = 2;
                    }
                    else if (2 < uVar10) goto LAB_00111dda;
                    iVar5 = bmp_read_palette(im,infile,uVar10,(uint)(info->type == 2));
                    if (iVar5 != 0) goto LAB_00111dda;
                    im->colorsTotal = info->numcolors;
                    lVar8 = gdTell(infile);
                    if ((lVar8 != *piVar11) && (iVar5 = gdSeek(infile,*piVar11), iVar5 == 0))
                    goto LAB_00111dda;
                    uVar3 = (long)(info->width + 7) / 8;
                    iVar5 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 |
                                        uVar3 & 0xffffffff) % 4);
                    local_34 = 4 - iVar5;
                    if (iVar5 == 0) {
                      local_34 = 0;
                    }
                    local_34 = local_34 + 1;
                    for (local_5c = 0; (int)local_5c < info->height; local_5c = local_5c + 1) {
                      uVar10 = info->height + ~local_5c;
                      if (info->topdown != '\0') {
                        uVar10 = local_5c;
                      }
                      local_78 = (int *)CONCAT44(local_78._4_4_,uVar10);
                      local_80 = (short *)0xffffffffffffffff;
                      for (iVar5 = 0; iVar6 = local_34, iVar5 < info->width; iVar5 = iVar5 + 8) {
                        iVar6 = gdGetByte(&red,infile);
                        if (iVar6 == 0) goto LAB_00111dda;
                        iVar6 = 0;
                        do {
                          if (iVar6 == 8) break;
                          bVar4 = (byte)(red << ((byte)iVar6 & 0x1f)) >> 7;
                          index = (int)bVar4;
                          if (im->open[bVar4] != 0) {
                            im->open[bVar4] = 0;
                          }
                          gdImageSetPixel(im,iVar5 + iVar6,(uint)local_78,index);
                          iVar7 = (int)local_80 + iVar6;
                          iVar6 = iVar6 + 1;
                        } while (iVar7 + 1 < info->width);
                        local_80 = (short *)(ulong)((int)local_80 + 8);
                      }
                      while (iVar6 + -1 != 0 && 0 < iVar6) {
                        iVar5 = gdGetByte(&index,infile);
                        iVar6 = iVar6 + -1;
                        if (iVar5 == 0) goto LAB_00111dda;
                      }
                    }
                  }
                  local_70 = (int *)((ulong)local_70 & 0xffffffff00000000);
LAB_00111dda:
                  gdFree(result);
                  gdFree(info);
                  if ((int)local_70 != 0) {
                    gdImageDestroy(im);
                    return (gdImagePtr)0x0;
                  }
                  return im;
                }
              }
            }
          }
        }
      }
    }
    else if (iVar5 == 0x28) {
LAB_00111383:
      iVar5 = gdGetIntLSB(&info->width,infile);
      if (iVar5 != 0) {
        piVar1 = &info->height;
        iVar5 = gdGetIntLSB(piVar1,infile);
        if (iVar5 != 0) {
          iVar5 = gdGetWordLSB(&info->numplanes,infile);
          if (iVar5 != 0) {
            local_80 = &info->depth;
            iVar5 = gdGetWordLSB(local_80,infile);
            if ((((iVar5 != 0) && (iVar5 = gdGetIntLSB(&info->enctype,infile), iVar5 != 0)) &&
                (iVar5 = gdGetIntLSB(&info->size,infile), iVar5 != 0)) &&
               ((iVar5 = gdGetIntLSB(&info->hres,infile), iVar5 != 0 &&
                (iVar5 = gdGetIntLSB(&info->vres,infile), iVar5 != 0)))) {
              local_78 = &info->numcolors;
              iVar5 = gdGetIntLSB(local_78,infile);
              if (iVar5 != 0) {
                local_70 = &info->mincolors;
                iVar5 = gdGetIntLSB(local_70,infile);
                if ((iVar5 != 0) && (uVar10 = *piVar1, (uVar10 & 0x7fffffff) != 0)) {
                  if ((int)uVar10 < 0) {
                    *piVar1 = -uVar10;
                  }
                  info->topdown = (int)uVar10 < 0;
                  info->type = 2;
                  if ((((0 < info->width) && (0 < info->numplanes)) &&
                      (uVar9 = *local_80, 0 < (short)uVar9)) &&
                     ((-1 < *local_78 && (-1 < *local_70)))) goto LAB_0011165d;
                }
              }
            }
          }
        }
      }
    }
    else if (iVar5 == 0x40) {
      iVar5 = gdGetIntLSB(&info->width,infile);
      if (iVar5 != 0) {
        piVar1 = &info->height;
        iVar5 = gdGetIntLSB(piVar1,infile);
        if (iVar5 != 0) {
          iVar5 = gdGetWordLSB(&info->numplanes,infile);
          if (iVar5 != 0) {
            local_80 = &info->depth;
            iVar5 = gdGetWordLSB(local_80,infile);
            if (((iVar5 != 0) && (iVar5 = gdGetIntLSB(&info->enctype,infile), iVar5 != 0)) &&
               ((iVar5 = gdGetIntLSB(&info->size,infile), iVar5 != 0 &&
                ((iVar5 = gdGetIntLSB(&info->hres,infile), iVar5 != 0 &&
                 (iVar5 = gdGetIntLSB(&info->vres,infile), iVar5 != 0)))))) {
              local_78 = &info->numcolors;
              iVar5 = gdGetIntLSB(local_78,infile);
              if (iVar5 != 0) {
                local_70 = &info->mincolors;
                iVar5 = gdGetIntLSB(local_70,infile);
                if (((iVar5 != 0) && (iVar5 = gdGetBuf(&index,0x18,infile), iVar5 != 0)) &&
                   (uVar10 = *piVar1, (uVar10 & 0x7fffffff) != 0)) {
                  if ((int)uVar10 < 0) {
                    *piVar1 = -uVar10;
                  }
                  info->topdown = (int)uVar10 < 0;
                  info->type = 2;
                  if (((0 < info->width) && (0 < info->numplanes)) &&
                     ((0 < *local_80 && ((-1 < *local_78 && (-1 < *local_70)))))) {
                    uVar9 = *local_80;
                    goto LAB_0011165d;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if ((iVar5 == 0x7c) || (iVar5 == 0x6c)) goto LAB_00111383;
  }
  gdFree(result);
  result = info;
LAB_00111483:
  gdFree(result);
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromBmpCtx(gdIOCtxPtr infile)
{
	bmp_hdr_t *hdr;
	bmp_info_t *info;
	gdImagePtr im = NULL;
	int error = 0;

	if (!(hdr= (bmp_hdr_t *)gdCalloc(1, sizeof(bmp_hdr_t)))) {
		return NULL;
	}

	if (bmp_read_header(infile, hdr)) {
		gdFree(hdr);
		return NULL;
	}

	if (hdr->magic != 0x4d42) {
		gdFree(hdr);
		return NULL;
	}

	if (!(info = (bmp_info_t *)gdCalloc(1, sizeof(bmp_info_t)))) {
		gdFree(hdr);
		return NULL;
	}

	if (bmp_read_info(infile, info)) {
		gdFree(hdr);
		gdFree(info);
		return NULL;
	}

	BMP_DEBUG(printf("Numcolours: %d\n", info->numcolors));
	BMP_DEBUG(printf("Width: %d\n", info->width));
	BMP_DEBUG(printf("Height: %d\n", info->height));
	BMP_DEBUG(printf("Planes: %d\n", info->numplanes));
	BMP_DEBUG(printf("Depth: %d\n", info->depth));
	BMP_DEBUG(printf("Offset: %d\n", hdr->off));

	if (info->depth >= 16) {
		im = gdImageCreateTrueColor(info->width, info->height);
	} else {
		im = gdImageCreate(info->width, info->height);
	}

	if (!im) {
		gdFree(hdr);
		gdFree(info);
		return NULL;
	}

	switch (info->depth) {
	case 1:
		BMP_DEBUG(printf("1-bit image\n"));
		error = bmp_read_1bit(im, infile, info, hdr);
		break;
	case 4:
		BMP_DEBUG(printf("4-bit image\n"));
		error = bmp_read_4bit(im, infile, info, hdr);
		break;
	case 8:
		BMP_DEBUG(printf("8-bit image\n"));
		error = bmp_read_8bit(im, infile, info, hdr);
		break;
	case 16:
	case 24:
	case 32:
		BMP_DEBUG(printf("Direct BMP image\n"));
		error = bmp_read_direct(im, infile, info, hdr);
		break;
	default:
		BMP_DEBUG(printf("Unknown bit count\n"));
		error = 1;
	}

	gdFree(hdr);
	gdFree(info);

	if (error) {
		gdImageDestroy(im);
		return NULL;
	}

	return im;
}